

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void DerefSentTimestep(SstStream Stream,WS_ReaderInfo Reader,ssize_t Timestep)

{
  _SentTimestepRec *p_Var1;
  CP_DP_PerReaderReleaseTimestepFunc p_Var2;
  _SentTimestepRec *p_Var3;
  _SentTimestepRec *p_Var4;
  _SentTimestepRec **pp_Var5;
  int SetLast;
  _SentTimestepRec *__ptr;
  
  p_Var1 = Reader->SentTimestepList;
  CP_verbose(Stream,PerRankVerbose,"Reader sent timestep list %p, trying to release %zd\n",p_Var1,
             Timestep);
  p_Var3 = (_SentTimestepRec *)0x0;
  do {
    __ptr = p_Var1;
    p_Var4 = p_Var3;
    if (__ptr == (_SentTimestepRec *)0x0) {
      return;
    }
    p_Var1 = __ptr->Next;
    CP_verbose(Stream,TraceVerbose,"Reader considering sent timestep %ld,trying to release %zd\n",
               __ptr->Timestep,Timestep);
    p_Var3 = __ptr;
  } while (__ptr->Timestep != Timestep);
  SubRefTimestep(Stream,Timestep,SetLast);
  free(__ptr);
  pp_Var5 = &p_Var4->Next;
  if (p_Var4 == (_SentTimestepRec *)0x0) {
    pp_Var5 = &Reader->SentTimestepList;
  }
  *pp_Var5 = p_Var1;
  pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
  p_Var2 = Stream->DP_Interface->readerReleaseTimestep;
  if (p_Var2 != (CP_DP_PerReaderReleaseTimestepFunc)0x0) {
    (*p_Var2)(&Svcs,Reader->DP_WSR_Stream,Timestep);
  }
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  return;
}

Assistant:

static void DerefSentTimestep(SstStream Stream, WS_ReaderInfo Reader, ssize_t Timestep)
{
    struct _SentTimestepRec *List = Reader->SentTimestepList, *Last = NULL;
    CP_verbose(Stream, PerRankVerbose, "Reader sent timestep list %p, trying to release %zd\n",
               (void *)Reader->SentTimestepList, Timestep);

    while (List)
    {

        int Freed = 0;
        struct _SentTimestepRec *Next = List->Next;
        CP_verbose(Stream, TraceVerbose,
                   "Reader considering sent timestep %ld,trying to release %zd\n", List->Timestep,
                   Timestep);
        if (List->Timestep == Timestep)
        {
            struct _SentTimestepRec *ItemToFree = List;
            Freed = 1;
            SubRefTimestep(Stream, ItemToFree->Timestep, 1);
            free(ItemToFree);
            if (Last)
            {
                Last->Next = Next;
            }
            else
            {
                Reader->SentTimestepList = Next;
            }
            /* per reader release here */
            STREAM_MUTEX_UNLOCK(Stream);
            if (Stream->DP_Interface->readerReleaseTimestep)
            {
                (Stream->DP_Interface->readerReleaseTimestep)(&Svcs, Reader->DP_WSR_Stream,
                                                              Timestep);
            }
            STREAM_MUTEX_LOCK(Stream);
            return;
        }
        if (!Freed)
        {
            Last = List;
        }
        List = Next;
    }
}